

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O0

void __thiscall hwnet::TCPConnector::Do(TCPConnector *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_60;
  lock_guard<std::mutex> guard;
  ErrorCallback errorCallback;
  ConnectCallback connectCallback;
  int fd_;
  TCPConnector *this_local;
  
  connectCallback._M_invoker._4_4_ = -1;
  std::function<void_(int)>::function
            ((function<void_(int)> *)&errorCallback._M_invoker,(nullptr_t)0x0);
  std::function<void_(int,_const_hwnet::Addr_&)>::function
            ((function<void_(int,_const_hwnet::Addr_&)> *)&guard,(nullptr_t)0x0);
  std::lock_guard<std::mutex>::lock_guard(&local_60,&this->mtx);
  if ((this->gotError & 1U) == 0) {
    std::function<void_(int)>::operator=
              ((function<void_(int)> *)&errorCallback._M_invoker,&this->connectCallback_);
    connectCallback._M_invoker._4_4_ = this->fd;
    this->fd = -1;
  }
  else {
    std::function<void_(int,_const_hwnet::Addr_&)>::operator=
              ((function<void_(int,_const_hwnet::Addr_&)> *)&guard,&this->errorCallback_);
    close(this->fd);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_60);
  bVar1 = std::operator!=((nullptr_t)0x0,(function<void_(int,_const_hwnet::Addr_&)> *)&guard);
  if (bVar1) {
    std::function<void_(int,_const_hwnet::Addr_&)>::operator()
              ((function<void_(int,_const_hwnet::Addr_&)> *)&guard,this->err,&this->remoteAddr);
  }
  else {
    bVar1 = std::operator!=((nullptr_t)0x0,(function<void_(int)> *)&errorCallback._M_invoker);
    if (bVar1) {
      std::function<void_(int)>::operator()
                ((function<void_(int)> *)&errorCallback._M_invoker,connectCallback._M_invoker._4_4_)
      ;
    }
  }
  std::function<void_(int,_const_hwnet::Addr_&)>::~function
            ((function<void_(int,_const_hwnet::Addr_&)> *)&guard);
  std::function<void_(int)>::~function((function<void_(int)> *)&errorCallback._M_invoker);
  return;
}

Assistant:

void TCPConnector::Do() {
	int fd_ = -1;
	ConnectCallback connectCallback = nullptr;
	ErrorCallback   errorCallback = nullptr;

	{
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this->gotError) {
			errorCallback = this->errorCallback_;
			::close(this->fd);
		} else {	
			connectCallback = this->connectCallback_;
			fd_ = this->fd;
			this->fd = -1;
		}
	}

	if(nullptr != errorCallback) {
		errorCallback(this->err,this->remoteAddr);
	} else if(nullptr != connectCallback) {
		connectCallback(fd_);
	}
}